

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_encoding_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_259c2::FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test::
TestBody(FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1b8;
  Message local_1b0;
  FieldEncodingEnum local_1a2 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_9;
  Message local_188;
  FieldEncodingEnum local_17a [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_8;
  Message local_160;
  FieldEncodingEnum local_152 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_7;
  Message local_138;
  FieldEncodingEnum local_12a [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_6;
  Message local_110;
  FieldEncodingEnum local_102 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_5;
  Message local_e8;
  FieldEncodingEnum local_da [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  FieldEncodingEnum local_b2 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  FieldEncodingEnum local_8a [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  FieldEncodingEnum local_62 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40 [3];
  FieldEncodingEnum local_22 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test *this_local;
  
  local_22[1] = 0x30;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_22[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x30);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((EqHelper<false> *)local_20,"FieldEncodingEnum::NOOP",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::NOOP)",local_22 + 1,local_22);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_62[1] = 0x31;
    local_62[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x31);
    testing::internal::EqHelper<false>::
    Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
              ((EqHelper<false> *)local_60,"FieldEncodingEnum::FIXED1",
               "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED1)",local_62 + 1,
               local_62);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                 ,0x1c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_8a[1] = 0x32;
      local_8a[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x32);
      testing::internal::EqHelper<false>::
      Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                ((EqHelper<false> *)local_88,"FieldEncodingEnum::FIXED2",
                 "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED2)",local_8a + 1,
                 local_8a);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                   ,0x1d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_98);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_b2[1] = 0x33;
        local_b2[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x33);
        testing::internal::EqHelper<false>::
        Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                  ((EqHelper<false> *)local_b0,"FieldEncodingEnum::FIXED3",
                   "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED3)",local_b2 + 1,
                   local_b2);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                     ,0x1e,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_c0);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_da[1] = 0x34;
          local_da[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x34);
          testing::internal::EqHelper<false>::
          Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                    ((EqHelper<false> *)local_d8,"FieldEncodingEnum::FIXED4",
                     "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED4)",local_da + 1,
                     local_da);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
          if (!bVar1) {
            testing::Message::Message(&local_e8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                       ,0x1f,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_e8);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_102[1] = 0x38;
            local_102[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x38);
            testing::internal::EqHelper<false>::
            Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                      ((EqHelper<false> *)local_100,"FieldEncodingEnum::FIXED8",
                       "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED8)",
                       local_102 + 1,local_102);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
            if (!bVar1) {
              testing::Message::Message(&local_110);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                         ,0x20,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_110);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_110);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              local_12a[1] = 0x40;
              local_12a[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x40);
              testing::internal::EqHelper<false>::
              Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                        ((EqHelper<false> *)local_128,"FieldEncodingEnum::FIXED16",
                         "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED16)",
                         local_12a + 1,local_12a);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
              if (!bVar1) {
                testing::Message::Message(&local_138);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                           ,0x21,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_138);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_138);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                local_152[1] = 0x42;
                local_152[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x42);
                testing::internal::EqHelper<false>::
                Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                          ((EqHelper<false> *)local_150,"FieldEncodingEnum::BYTE_ARRAY",
                           "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::BYTE_ARRAY)",
                           local_152 + 1,local_152);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_150);
                if (!bVar1) {
                  testing::Message::Message(&local_160);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                             ,0x22,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_160);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_160);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  local_17a[1] = 0x53;
                  local_17a[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x53)
                  ;
                  testing::internal::EqHelper<false>::
                  Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                            ((EqHelper<false> *)local_178,"FieldEncodingEnum::VARINT_STRING",
                             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT_STRING)"
                             ,local_17a + 1,local_17a);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_178);
                  if (!bVar1) {
                    testing::Message::Message(&local_188);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                               ,0x23,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_188);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_188);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    local_1a2[1] = 0x56;
                    local_1a2[0] = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf
                                             (0x56);
                    testing::internal::EqHelper<false>::
                    Compare<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                              ((EqHelper<false> *)local_1a0,"FieldEncodingEnum::VARINT",
                               "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT)",
                               local_1a2 + 1,local_1a2);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1a0);
                    if (!bVar1) {
                      testing::Message::Message(&local_1b0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1a0);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_1b8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                                 ,0x24,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
                      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
                      testing::Message::~Message(&local_1b0);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(FieldEncodingTest, TestValueOfCodeReturnsSameFieldEncodingType)
{
    ASSERT_EQ(FieldEncodingEnum::NOOP, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::NOOP));
    ASSERT_EQ(FieldEncodingEnum::FIXED1, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED1));
    ASSERT_EQ(FieldEncodingEnum::FIXED2, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED2));
    ASSERT_EQ(FieldEncodingEnum::FIXED3, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED3));
    ASSERT_EQ(FieldEncodingEnum::FIXED4, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED4));
    ASSERT_EQ(FieldEncodingEnum::FIXED8, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED8));
    ASSERT_EQ(FieldEncodingEnum::FIXED16, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED16));
    ASSERT_EQ(FieldEncodingEnum::BYTE_ARRAY, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::BYTE_ARRAY));
    ASSERT_EQ(FieldEncodingEnum::VARINT_STRING, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT_STRING));
    ASSERT_EQ(FieldEncodingEnum::VARINT, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT));
}